

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_decoder.c
# Opt level: O2

lzma_ret stream_decode(void *coder_ptr,lzma_allocator *allocator,uint8_t *in,size_t *in_pos,
                      size_t in_size,uint8_t *out,size_t *out_pos,size_t out_size,lzma_action action
                      )

{
  lzma_block *block;
  uint8_t *out_00;
  size_t *out_pos_00;
  lzma_check type;
  lzma_index_hash *index_hash;
  lzma_bool lVar1;
  byte bVar2;
  lzma_ret lVar3;
  uint uVar4;
  undefined4 uVar5;
  void *pvVar6;
  ulong uVar7;
  uint64_t uVar8;
  lzma_vli unpadded_size;
  long lVar9;
  lzma_filter filters [5];
  
  out_00 = (uint8_t *)((long)coder_ptr + 0x180);
  out_pos_00 = (size_t *)((long)coder_ptr + 0x178);
  block = (lzma_block *)((long)coder_ptr + 0x50);
  do {
    switch(*coder_ptr) {
    case 0:
      lzma_bufcpy(in,in_pos,in_size,out_00,out_pos_00,0xc);
      if (*out_pos_00 < 0xc) {
        return LZMA_OK;
      }
      *out_pos_00 = 0;
      lVar3 = lzma_stream_header_decode((lzma_stream_flags *)((long)coder_ptr + 0x120),out_00);
      if (lVar3 != LZMA_OK) {
        if (lVar3 == LZMA_FORMAT_ERROR) {
          return (*(byte *)((long)coder_ptr + 0x175) ^ 1) * 2 + LZMA_FORMAT_ERROR;
        }
        return lVar3;
      }
      *(undefined1 *)((long)coder_ptr + 0x175) = 0;
      type = *(lzma_check *)((long)coder_ptr + 0x130);
      *(lzma_check *)((long)coder_ptr + 0x58) = type;
      *(undefined4 *)coder_ptr = 1;
      if ((*(byte *)((long)coder_ptr + 0x170) & type == LZMA_CHECK_NONE) != 0) {
        return LZMA_NO_CHECK;
      }
      if ((*(char *)((long)coder_ptr + 0x171) == '\x01') &&
         (lVar1 = lzma_check_is_supported(type), lVar1 == '\0')) {
        return LZMA_UNSUPPORTED_CHECK;
      }
      if (*(char *)((long)coder_ptr + 0x172) != '\0') {
        return LZMA_GET_CHECK;
      }
    case 1:
      if (in_size <= *in_pos) {
        return LZMA_OK;
      }
      if (*out_pos_00 == 0) {
        uVar5 = 3;
        if (in[*in_pos] != 0) {
          uVar4 = (uint)in[*in_pos] * 4 + 4;
          *(uint *)((long)coder_ptr + 0x54) = uVar4;
          goto LAB_00191d64;
        }
      }
      else {
        uVar4 = *(uint *)((long)coder_ptr + 0x54);
LAB_00191d64:
        lzma_bufcpy(in,in_pos,in_size,out_00,out_pos_00,(ulong)uVar4);
        if (*(ulong *)((long)coder_ptr + 0x178) < (ulong)*(uint *)((long)coder_ptr + 0x54)) {
          return LZMA_OK;
        }
        *(undefined8 *)((long)coder_ptr + 0x178) = 0;
        *(undefined4 *)((long)coder_ptr + 0x50) = 1;
        *(lzma_filter **)((long)coder_ptr + 0x70) = filters;
        lVar3 = lzma_block_header_decode(block,allocator,out_00);
        if (lVar3 != LZMA_OK) {
          return lVar3;
        }
        *(undefined1 *)((long)coder_ptr + 0x118) = *(undefined1 *)((long)coder_ptr + 0x173);
        uVar8 = lzma_raw_decoder_memusage(filters);
        lVar3 = LZMA_OPTIONS_ERROR;
        if (uVar8 != 0xffffffffffffffff) {
          *(uint64_t *)((long)coder_ptr + 0x168) = uVar8;
          lVar3 = LZMA_MEMLIMIT_ERROR;
          if (uVar8 <= *(ulong *)((long)coder_ptr + 0x160)) {
            lVar3 = lzma_block_decoder_init
                              ((lzma_next_coder *)((long)coder_ptr + 8),allocator,block);
          }
        }
        for (lVar9 = 8; lVar9 != 0x48; lVar9 = lVar9 + 0x10) {
          lzma_free(*(void **)((long)&filters[0].id + lVar9),allocator);
        }
        *(undefined8 *)((long)coder_ptr + 0x70) = 0;
        if (lVar3 != LZMA_OK) {
          return lVar3;
        }
        *(undefined4 *)coder_ptr = 2;
switchD_00191b6f_caseD_2:
        lVar3 = (**(code **)((long)coder_ptr + 0x20))
                          (*(undefined8 *)((long)coder_ptr + 8),allocator,in,in_pos,in_size,out,
                           out_pos,out_size,action);
        if (lVar3 != LZMA_STREAM_END) {
          return lVar3;
        }
        index_hash = *(lzma_index_hash **)((long)coder_ptr + 0x158);
        unpadded_size = lzma_block_unpadded_size(block);
        lVar3 = lzma_index_hash_append
                          (index_hash,unpadded_size,*(lzma_vli *)((long)coder_ptr + 0x68));
        uVar5 = 1;
        if (lVar3 != LZMA_OK) {
          return lVar3;
        }
      }
      *(undefined4 *)coder_ptr = uVar5;
      break;
    case 2:
      goto switchD_00191b6f_caseD_2;
    case 3:
      if (in_size <= *in_pos) {
        return LZMA_OK;
      }
      lVar3 = lzma_index_hash_decode
                        (*(lzma_index_hash **)((long)coder_ptr + 0x158),in,in_pos,in_size);
      if (lVar3 != LZMA_STREAM_END) {
        return lVar3;
      }
      *(undefined4 *)coder_ptr = 4;
    case 4:
      lzma_bufcpy(in,in_pos,in_size,out_00,out_pos_00,0xc);
      if (*out_pos_00 < 0xc) {
        return LZMA_OK;
      }
      *out_pos_00 = 0;
      lVar3 = lzma_stream_footer_decode((lzma_stream_flags *)filters,out_00);
      if (lVar3 != LZMA_OK) {
        if (lVar3 != LZMA_FORMAT_ERROR) {
          return lVar3;
        }
        return LZMA_DATA_ERROR;
      }
      pvVar6 = (void *)lzma_index_hash_size(*(lzma_index_hash **)((long)coder_ptr + 0x158));
      if (pvVar6 != filters[0].options) {
        return LZMA_DATA_ERROR;
      }
      lVar3 = lzma_stream_flags_compare
                        ((lzma_stream_flags *)((long)coder_ptr + 0x120),(lzma_stream_flags *)filters
                        );
      if (lVar3 != LZMA_OK) {
        return lVar3;
      }
      bVar2 = *(byte *)((long)coder_ptr + 0x174);
      if (bVar2 == 0) {
        return LZMA_STREAM_END;
      }
      *(undefined4 *)coder_ptr = 5;
      goto LAB_00191cef;
    case 5:
      bVar2 = *(byte *)((long)coder_ptr + 0x174);
LAB_00191cef:
      if ((bVar2 & 1) == 0) {
        __assert_fail("coder->concatenated",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/common/stream_decoder.c"
                      ,0x14d,
                      "lzma_ret stream_decode(void *, const lzma_allocator *, const uint8_t *restrict, size_t *restrict, size_t, uint8_t *restrict, size_t *restrict, size_t, lzma_action)"
                     );
      }
      uVar7 = *in_pos;
      while( true ) {
        if (in_size <= uVar7) {
          if (action != LZMA_FINISH) {
            return LZMA_OK;
          }
          return (uint)(*out_pos_00 != 0) * 8 + LZMA_STREAM_END;
        }
        if (in[uVar7] != '\0') break;
        uVar7 = uVar7 + 1;
        *in_pos = uVar7;
        *out_pos_00 = (ulong)(*(int *)out_pos_00 + 1U & 3);
      }
      if (*out_pos_00 != 0) {
        *in_pos = uVar7 + 1;
        return LZMA_DATA_ERROR;
      }
      lVar3 = stream_decoder_reset((lzma_stream_coder *)coder_ptr,allocator);
      if (lVar3 != LZMA_OK) {
        return lVar3;
      }
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/common/stream_decoder.c"
                    ,0x173,
                    "lzma_ret stream_decode(void *, const lzma_allocator *, const uint8_t *restrict, size_t *restrict, size_t, uint8_t *restrict, size_t *restrict, size_t, lzma_action)"
                   );
    }
  } while( true );
}

Assistant:

static lzma_ret
stream_decode(void *coder_ptr, const lzma_allocator *allocator,
		const uint8_t *restrict in, size_t *restrict in_pos,
		size_t in_size, uint8_t *restrict out,
		size_t *restrict out_pos, size_t out_size, lzma_action action)
{
	lzma_stream_coder *coder = coder_ptr;

	// When decoding the actual Block, it may be able to produce more
	// output even if we don't give it any new input.
	while (true)
	switch (coder->sequence) {
	case SEQ_STREAM_HEADER: {
		// Copy the Stream Header to the internal buffer.
		lzma_bufcpy(in, in_pos, in_size, coder->buffer, &coder->pos,
				LZMA_STREAM_HEADER_SIZE);

		// Return if we didn't get the whole Stream Header yet.
		if (coder->pos < LZMA_STREAM_HEADER_SIZE)
			return LZMA_OK;

		coder->pos = 0;

		// Decode the Stream Header.
		const lzma_ret ret = lzma_stream_header_decode(
				&coder->stream_flags, coder->buffer);
		if (ret != LZMA_OK)
			return ret == LZMA_FORMAT_ERROR && !coder->first_stream
					? LZMA_DATA_ERROR : ret;

		// If we are decoding concatenated Streams, and the later
		// Streams have invalid Header Magic Bytes, we give
		// LZMA_DATA_ERROR instead of LZMA_FORMAT_ERROR.
		coder->first_stream = false;

		// Copy the type of the Check so that Block Header and Block
		// decoders see it.
		coder->block_options.check = coder->stream_flags.check;

		// Even if we return LZMA_*_CHECK below, we want
		// to continue from Block Header decoding.
		coder->sequence = SEQ_BLOCK_HEADER;

		// Detect if there's no integrity check or if it is
		// unsupported if those were requested by the application.
		if (coder->tell_no_check && coder->stream_flags.check
				== LZMA_CHECK_NONE)
			return LZMA_NO_CHECK;

		if (coder->tell_unsupported_check
				&& !lzma_check_is_supported(
					coder->stream_flags.check))
			return LZMA_UNSUPPORTED_CHECK;

		if (coder->tell_any_check)
			return LZMA_GET_CHECK;
	}

	// Fall through

	case SEQ_BLOCK_HEADER: {
		if (*in_pos >= in_size)
			return LZMA_OK;

		if (coder->pos == 0) {
			// Detect if it's Index.
			if (in[*in_pos] == 0x00) {
				coder->sequence = SEQ_INDEX;
				break;
			}

			// Calculate the size of the Block Header. Note that
			// Block Header decoder wants to see this byte too
			// so don't advance *in_pos.
			coder->block_options.header_size
					= lzma_block_header_size_decode(
						in[*in_pos]);
		}

		// Copy the Block Header to the internal buffer.
		lzma_bufcpy(in, in_pos, in_size, coder->buffer, &coder->pos,
				coder->block_options.header_size);

		// Return if we didn't get the whole Block Header yet.
		if (coder->pos < coder->block_options.header_size)
			return LZMA_OK;

		coder->pos = 0;

		// Version 1 is needed to support the .ignore_check option.
		coder->block_options.version = 1;

		// Set up a buffer to hold the filter chain. Block Header
		// decoder will initialize all members of this array so
		// we don't need to do it here.
		lzma_filter filters[LZMA_FILTERS_MAX + 1];
		coder->block_options.filters = filters;

		// Decode the Block Header.
		return_if_error(lzma_block_header_decode(&coder->block_options,
				allocator, coder->buffer));

		// If LZMA_IGNORE_CHECK was used, this flag needs to be set.
		// It has to be set after lzma_block_header_decode() because
		// it always resets this to false.
		coder->block_options.ignore_check = coder->ignore_check;

		// Check the memory usage limit.
		const uint64_t memusage = lzma_raw_decoder_memusage(filters);
		lzma_ret ret;

		if (memusage == UINT64_MAX) {
			// One or more unknown Filter IDs.
			ret = LZMA_OPTIONS_ERROR;
		} else {
			// Now we can set coder->memusage since we know that
			// the filter chain is valid. We don't want
			// lzma_memusage() to return UINT64_MAX in case of
			// invalid filter chain.
			coder->memusage = memusage;

			if (memusage > coder->memlimit) {
				// The chain would need too much memory.
				ret = LZMA_MEMLIMIT_ERROR;
			} else {
				// Memory usage is OK.
				// Initialize the Block decoder.
				ret = lzma_block_decoder_init(
						&coder->block_decoder,
						allocator,
						&coder->block_options);
			}
		}

		// Free the allocated filter options since they are needed
		// only to initialize the Block decoder.
		for (size_t i = 0; i < LZMA_FILTERS_MAX; ++i)
			lzma_free(filters[i].options, allocator);

		coder->block_options.filters = NULL;

		// Check if memory usage calculation and Block enocoder
		// initialization succeeded.
		if (ret != LZMA_OK)
			return ret;

		coder->sequence = SEQ_BLOCK;
	}

	// Fall through

	case SEQ_BLOCK: {
		const lzma_ret ret = coder->block_decoder.code(
				coder->block_decoder.coder, allocator,
				in, in_pos, in_size, out, out_pos, out_size,
				action);

		if (ret != LZMA_STREAM_END)
			return ret;

		// Block decoded successfully. Add the new size pair to
		// the Index hash.
		return_if_error(lzma_index_hash_append(coder->index_hash,
				lzma_block_unpadded_size(
					&coder->block_options),
				coder->block_options.uncompressed_size));

		coder->sequence = SEQ_BLOCK_HEADER;
		break;
	}

	case SEQ_INDEX: {
		// If we don't have any input, don't call
		// lzma_index_hash_decode() since it would return
		// LZMA_BUF_ERROR, which we must not do here.
		if (*in_pos >= in_size)
			return LZMA_OK;

		// Decode the Index and compare it to the hash calculated
		// from the sizes of the Blocks (if any).
		const lzma_ret ret = lzma_index_hash_decode(coder->index_hash,
				in, in_pos, in_size);
		if (ret != LZMA_STREAM_END)
			return ret;

		coder->sequence = SEQ_STREAM_FOOTER;
	}

	// Fall through

	case SEQ_STREAM_FOOTER: {
		// Copy the Stream Footer to the internal buffer.
		lzma_bufcpy(in, in_pos, in_size, coder->buffer, &coder->pos,
				LZMA_STREAM_HEADER_SIZE);

		// Return if we didn't get the whole Stream Footer yet.
		if (coder->pos < LZMA_STREAM_HEADER_SIZE)
			return LZMA_OK;

		coder->pos = 0;

		// Decode the Stream Footer. The decoder gives
		// LZMA_FORMAT_ERROR if the magic bytes don't match,
		// so convert that return code to LZMA_DATA_ERROR.
		lzma_stream_flags footer_flags;
		const lzma_ret ret = lzma_stream_footer_decode(
				&footer_flags, coder->buffer);
		if (ret != LZMA_OK)
			return ret == LZMA_FORMAT_ERROR
					? LZMA_DATA_ERROR : ret;

		// Check that Index Size stored in the Stream Footer matches
		// the real size of the Index field.
		if (lzma_index_hash_size(coder->index_hash)
				!= footer_flags.backward_size)
			return LZMA_DATA_ERROR;

		// Compare that the Stream Flags fields are identical in
		// both Stream Header and Stream Footer.
		return_if_error(lzma_stream_flags_compare(
				&coder->stream_flags, &footer_flags));

		if (!coder->concatenated)
			return LZMA_STREAM_END;

		coder->sequence = SEQ_STREAM_PADDING;
	}

	// Fall through

	case SEQ_STREAM_PADDING:
		assert(coder->concatenated);

		// Skip over possible Stream Padding.
		while (true) {
			if (*in_pos >= in_size) {
				// Unless LZMA_FINISH was used, we cannot
				// know if there's more input coming later.
				if (action != LZMA_FINISH)
					return LZMA_OK;

				// Stream Padding must be a multiple of
				// four bytes.
				return coder->pos == 0
						? LZMA_STREAM_END
						: LZMA_DATA_ERROR;
			}

			// If the byte is not zero, it probably indicates
			// beginning of a new Stream (or the file is corrupt).
			if (in[*in_pos] != 0x00)
				break;

			++*in_pos;
			coder->pos = (coder->pos + 1) & 3;
		}

		// Stream Padding must be a multiple of four bytes (empty
		// Stream Padding is OK).
		if (coder->pos != 0) {
			++*in_pos;
			return LZMA_DATA_ERROR;
		}

		// Prepare to decode the next Stream.
		return_if_error(stream_decoder_reset(coder, allocator));
		break;

	default:
		assert(0);
		return LZMA_PROG_ERROR;
	}

	// Never reached
}